

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

void Randomize(Mat *m,float a,float b)

{
  size_t sVar1;
  float *pfVar2;
  Mat *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float in_XMM1_Da;
  size_t i;
  undefined8 local_18;
  
  local_18 = 0;
  while( true ) {
    sVar1 = ncnn::Mat::total(in_RDI);
    if (sVar1 <= local_18) break;
    fVar3 = RandomFloat(in_XMM0_Da,in_XMM1_Da);
    pfVar2 = ncnn::Mat::operator[](in_RDI,local_18);
    *pfVar2 = fVar3;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

static void Randomize(ncnn::Mat& m, float a = -2.f, float b = 2.f)
{
    for (size_t i=0; i<m.total(); i++)
    {
        m[i] = RandomFloat(a, b);
    }
}